

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QList<Qt::DayOfWeek> * __thiscall
QLocale::weekdays(QList<Qt::DayOfWeek> *__return_storage_ptr__,QLocale *this)

{
  Data *pDVar1;
  QSystemLocale *pQVar2;
  uint uVar3;
  int day;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  anon_union_24_3_e3d07ef4_for_data local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (DayOfWeek *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar2 = systemLocale();
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    local_60 = 2;
    (*pQVar2->_vptr_QSystemLocale[2])(&local_50,pQVar2,0x1e);
    qvariant_cast<QList<Qt::DayOfWeek>>(__return_storage_ptr__,(QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_78);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0030efc4;
    pDVar1 = (__return_storage_ptr__->d).d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,4,0x10);
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (DayOfWeek *)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar3 = *(uint *)&((this->d).d.ptr)->m_data->field_0x78;
  uVar5 = uVar3 >> 8 & 7;
  uVar3 = uVar3 >> 0xb & 7;
  uVar4 = 1;
  do {
    if (uVar3 < uVar5) {
      if (uVar4 < uVar5 && uVar3 < uVar4) {
LAB_0030ef2d:
        local_50._0_4_ = uVar4;
        QtPrivate::QPodArrayOps<Qt::DayOfWeek>::emplace<Qt::DayOfWeek&>
                  ((QPodArrayOps<Qt::DayOfWeek> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,(DayOfWeek *)local_50.data);
        QList<Qt::DayOfWeek>::end(__return_storage_ptr__);
      }
    }
    else if (uVar3 < uVar4 || uVar4 < uVar5) goto LAB_0030ef2d;
    uVar4 = uVar4 + 1;
  } while (uVar4 != 8);
LAB_0030efc4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<Qt::DayOfWeek> QLocale::weekdays() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res
            = qvariant_cast<QList<Qt::DayOfWeek> >(systemLocale()->query(QSystemLocale::Weekdays));
        if (!res.isEmpty())
            return res;
    }
#endif
    QList<Qt::DayOfWeek> weekdays;
    quint16 weekendStart = d->m_data->m_weekend_start;
    quint16 weekendEnd = d->m_data->m_weekend_end;
    for (int day = Qt::Monday; day <= Qt::Sunday; day++) {
        if ((weekendEnd >= weekendStart && (day < weekendStart || day > weekendEnd)) ||
            (weekendEnd < weekendStart && (day > weekendEnd && day < weekendStart)))
                weekdays << static_cast<Qt::DayOfWeek>(day);
    }
    return weekdays;
}